

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O0

sat_solver * Ifn_ManSatBuild(Ifn_Ntk_t *p,Vec_Int_t **pvPiVars,Vec_Int_t **pvPoVars)

{
  Gia_Man_t *p_00;
  Gia_Man_t *p_01;
  sat_solver *psVar1;
  sat_solver *pSat;
  Gia_Man_t *p2;
  Gia_Man_t *p1;
  Vec_Int_t **pvPoVars_local;
  Vec_Int_t **pvPiVars_local;
  Ifn_Ntk_t *p_local;
  
  *pvPoVars = (Vec_Int_t *)0x0;
  *pvPiVars = (Vec_Int_t *)0x0;
  p_00 = Ifn_ManStrFindModel(p);
  p_01 = Ifn_ManStrFindCofactors(p->nInps,p_00);
  Gia_ManStop(p_00);
  psVar1 = Ifn_ManStrFindSolver(p_01,pvPiVars,pvPoVars);
  Gia_ManStop(p_01);
  return psVar1;
}

Assistant:

sat_solver * Ifn_ManSatBuild( Ifn_Ntk_t * p, Vec_Int_t ** pvPiVars, Vec_Int_t ** pvPoVars )
{
    Gia_Man_t * p1, * p2;
    sat_solver * pSat = NULL;
    *pvPiVars = *pvPoVars = NULL;
    p1 = Ifn_ManStrFindModel( p );
//    Gia_AigerWrite( p1, "satbuild.aig", 0, 0, 0 );
    p2 = Ifn_ManStrFindCofactors( p->nInps, p1 );
    Gia_ManStop( p1 );
//    Gia_AigerWrite( p2, "satbuild2.aig", 0, 0, 0 );
    pSat = Ifn_ManStrFindSolver( p2, pvPiVars, pvPoVars );
    Gia_ManStop( p2 );
    return pSat;
}